

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesShaderIntrinsicsBase.cpp
# Opt level: O2

string * vkt::sparse::getOpTypeImageSparse
                   (string *__return_storage_ptr__,ImageType imageType,TextureFormat *format,
                   string *componentType,bool requiresSampler)

{
  ChannelOrder CVar1;
  uint uVar2;
  ostream *poVar3;
  char *pcVar4;
  ostringstream src;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  poVar3 = std::operator<<((ostream *)&src,"OpTypeImage ");
  poVar3 = std::operator<<(poVar3,(string *)componentType);
  std::operator<<(poVar3," ");
  if (imageType < IMAGE_TYPE_BUFFER) {
    std::operator<<((ostream *)&src,&DAT_009de150 + *(int *)(&DAT_009de150 + (ulong)imageType * 4));
  }
  pcVar4 = "2 ";
  if (requiresSampler) {
    pcVar4 = "1 ";
  }
  std::operator<<((ostream *)&src,pcVar4);
  CVar1 = format->order;
  if (((ulong)CVar1 < 9) && ((0x1a1U >> (CVar1 & (sBGR|sRGBA)) & 1) != 0)) {
    std::operator<<((ostream *)&src,&DAT_009de16c + *(int *)(&DAT_009de16c + (ulong)CVar1 * 4));
  }
  uVar2 = format->type - SIGNED_INT8;
  if ((uVar2 < 7) && ((0x5fU >> (uVar2 & 0x1f) & 1) != 0)) {
    std::operator<<((ostream *)&src,&DAT_009de190 + *(int *)(&DAT_009de190 + (ulong)uVar2 * 4));
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  return __return_storage_ptr__;
}

Assistant:

std::string getOpTypeImageSparse (const ImageType			imageType,
								  const tcu::TextureFormat&	format,
								  const std::string&		componentType,
								  const bool				requiresSampler)
{
	std::ostringstream	src;

	src << "OpTypeImage " << componentType << " ";

	switch (imageType)
	{
		case IMAGE_TYPE_1D :
			src << "1D 0 0 0 ";
		break;
		case IMAGE_TYPE_1D_ARRAY :
			src << "1D 0 1 0 ";
		break;
		case IMAGE_TYPE_2D :
			src << "2D 0 0 0 ";
		break;
		case IMAGE_TYPE_2D_ARRAY :
			src << "2D 0 1 0 ";
		break;
		case IMAGE_TYPE_3D :
			src << "3D 0 0 0 ";
		break;
		case IMAGE_TYPE_CUBE :
			src << "Cube 0 0 0 ";
		break;
		case IMAGE_TYPE_CUBE_ARRAY :
			src << "Cube 0 1 0 ";
		break;
		default :
			DE_ASSERT(0);
		break;
	};

	if (requiresSampler)
		src << "1 ";
	else
		src << "2 ";

	switch (format.order)
	{
		case tcu::TextureFormat::R:
			src << "R";
		break;
		case tcu::TextureFormat::RG:
			src << "Rg";
			break;
		case tcu::TextureFormat::RGB:
			src << "Rgb";
			break;
		case tcu::TextureFormat::RGBA:
			src << "Rgba";
		break;
		default:
			DE_ASSERT(0);
		break;
	}

	switch (format.type)
	{
		case tcu::TextureFormat::SIGNED_INT8:
			src << "8i";
		break;
		case tcu::TextureFormat::SIGNED_INT16:
			src << "16i";
		break;
		case tcu::TextureFormat::SIGNED_INT32:
			src << "32i";
		break;
		case tcu::TextureFormat::UNSIGNED_INT8:
			src << "8ui";
		break;
		case tcu::TextureFormat::UNSIGNED_INT16:
			src << "16ui";
		break;
		case tcu::TextureFormat::UNSIGNED_INT32:
			src << "32ui";
		break;
		default:
			DE_ASSERT(0);
		break;
	};

	return src.str();
}